

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O0

ssize_t mqtt_pack_publish_request
                  (uint8_t *buf,size_t bufsz,char *topic_name,uint16_t packet_id,
                  void *application_message,size_t application_message_size,uint8_t publish_flags)

{
  char cVar1;
  MQTTControlPacketType MVar2;
  size_t sVar3;
  uint8_t *buf_00;
  ssize_t sVar4;
  int local_60;
  undefined1 auStack_5c [3];
  uint8_t inspected_qos;
  uint32_t remaining_length;
  mqtt_fixed_header fixed_header;
  ssize_t rv;
  uint8_t *start;
  size_t application_message_size_local;
  void *application_message_local;
  uint16_t packet_id_local;
  char *topic_name_local;
  size_t bufsz_local;
  uint8_t *buf_local;
  
  if ((buf == (uint8_t *)0x0) || (topic_name == (char *)0x0)) {
    buf_local = (uint8_t *)0xffffffff80000001;
  }
  else {
    cVar1 = (char)((int)(publish_flags & 6) >> 1);
    _auStack_5c = MQTT_CONTROL_PUBLISH;
    sVar3 = strlen(topic_name);
    local_60 = (int)sVar3 + 2;
    if (cVar1 != '\0') {
      local_60 = (int)sVar3 + 4;
    }
    MVar2 = (int)application_message_size + local_60;
    if (cVar1 == '\0') {
      publish_flags = publish_flags & 0xf7;
    }
    if (cVar1 == '\x03') {
      buf_local = (uint8_t *)0xffffffff8000000a;
    }
    else {
      remaining_length._0_1_ = (byte)remaining_length & 0xf0 | publish_flags & 7;
      fixed_header.control_type = MVar2;
      fixed_header._4_8_ = mqtt_pack_fixed_header(buf,bufsz,(mqtt_fixed_header *)auStack_5c);
      buf_local = (uint8_t *)fixed_header._4_8_;
      if (0 < (long)fixed_header._4_8_) {
        buf_00 = (uint8_t *)(fixed_header._4_8_ + (long)buf);
        if (bufsz - fixed_header._4_8_ < (ulong)MVar2) {
          buf_local = (uint8_t *)0x0;
        }
        else {
          sVar4 = __mqtt_pack_str(buf_00,topic_name);
          bufsz_local = (size_t)(buf_00 + sVar4);
          if (cVar1 != '\0') {
            sVar4 = __mqtt_pack_uint16((uint8_t *)bufsz_local,packet_id);
            bufsz_local = bufsz_local + sVar4;
          }
          memcpy((void *)bufsz_local,application_message,application_message_size);
          buf_local = (uint8_t *)((application_message_size + bufsz_local) - (long)buf);
        }
      }
    }
  }
  return (ssize_t)buf_local;
}

Assistant:

ssize_t mqtt_pack_publish_request(uint8_t *buf, size_t bufsz,
                                  const char* topic_name,
                                  uint16_t packet_id,
                                  const void* application_message,
                                  size_t application_message_size,
                                  uint8_t publish_flags)
{
    const uint8_t *const start = buf;
    ssize_t rv;
    struct mqtt_fixed_header fixed_header;
    uint32_t remaining_length;
    uint8_t inspected_qos;

    /* check for null pointers */
    if(buf == NULL || topic_name == NULL) {
        return MQTT_ERROR_NULLPTR;
    }

    /* inspect QoS level */
    inspected_qos = (publish_flags & MQTT_PUBLISH_QOS_MASK) >> 1; /* mask */

    /* build the fixed header */
    fixed_header.control_type = MQTT_CONTROL_PUBLISH;

    /* calculate remaining length */
    remaining_length = (uint32_t)__mqtt_packed_cstrlen(topic_name);
    if (inspected_qos > 0) {
        remaining_length += 2;
    }
    remaining_length += (uint32_t)application_message_size;
    fixed_header.remaining_length = remaining_length;

    /* force dup to 0 if qos is 0 [Spec MQTT-3.3.1-2] */
    if (inspected_qos == 0) {
        publish_flags &= (uint8_t)~MQTT_PUBLISH_DUP;
    }

    /* make sure that qos is not 3 [Spec MQTT-3.3.1-4] */
    if (inspected_qos == 3) {
        return MQTT_ERROR_PUBLISH_FORBIDDEN_QOS;
    }
    fixed_header.control_flags = publish_flags & 0x7;

    /* pack fixed header */
    rv = mqtt_pack_fixed_header(buf, bufsz, &fixed_header);
    if (rv <= 0) {
        /* something went wrong */
        return rv;
    }
    buf += rv;
    bufsz -= (size_t)rv;

    /* check that buffer is big enough */
    if (bufsz < remaining_length) {
        return 0;
    }

    /* pack variable header */
    buf += __mqtt_pack_str(buf, topic_name);
    if (inspected_qos > 0) {
        buf += __mqtt_pack_uint16(buf, packet_id);
    }

    /* pack payload */
    memcpy(buf, application_message, application_message_size);
    buf += application_message_size;

    return buf - start;
}